

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Ray * __thiscall
pbrt::Transform::operator()(Ray *__return_storage_ptr__,Transform *this,Ray *r,Float *tMax)

{
  float fVar1;
  Float FVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar12 [60];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vector3<float> VVar17;
  Point3fi o;
  Point3fi local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Interval<float> local_28;
  undefined1 auVar9 [56];
  
  fVar1 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar7._4_4_ = fVar1;
  auVar7._0_4_ = fVar1;
  auVar7._8_4_ = fVar1;
  auVar7._12_4_ = fVar1;
  fVar1 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._4_4_ = fVar1;
  auVar10._0_4_ = fVar1;
  auVar10._8_4_ = fVar1;
  auVar10._12_4_ = fVar1;
  auVar12 = ZEXT1260(auVar10._4_12_);
  fVar1 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._4_4_ = fVar1;
  auVar13._0_4_ = fVar1;
  auVar13._8_4_ = fVar1;
  auVar13._12_4_ = fVar1;
  local_38 = vmovlhps_avx(auVar7,auVar10);
  auVar9 = ZEXT856(local_38._8_8_);
  local_28 = (Interval<float>)vmovlps_avx(auVar13);
  operator()(&local_88,this,(Point3fi *)local_38);
  VVar17 = operator()(this,&r->d);
  auVar11._0_4_ = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._4_60_ = auVar12;
  auVar8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  local_58 = auVar8._0_16_;
  auVar7 = vmovshdup_avx(local_58);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar7._0_4_)),local_58,local_58);
  local_48 = auVar11._0_16_;
  auVar10 = vfmadd231ss_fma(auVar10,local_48,local_48);
  if (0.0 < auVar10._0_4_) {
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx(auVar7,auVar14);
    auVar13 = vandps_avx(local_58,auVar14);
    auVar14 = vandps_avx(local_48,auVar14);
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar13);
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT816(0) << 0x40,auVar14);
    local_68._0_4_ = auVar7._0_4_ / auVar10._0_4_;
    local_68._4_12_ = auVar7._4_12_;
    auVar15._0_4_ = VVar17.super_Tuple3<pbrt::Vector3,_float>.x * (float)local_68._0_4_;
    auVar15._4_4_ = VVar17.super_Tuple3<pbrt::Vector3,_float>.y * (float)local_68._0_4_;
    auVar15._8_4_ = auVar9._0_4_ * (float)local_68._0_4_;
    auVar15._12_4_ = auVar9._4_4_ * (float)local_68._0_4_;
    uVar3 = vmovlps_avx(auVar15);
    local_38._8_4_ = auVar11._0_4_ * (float)local_68._0_4_;
    local_38._0_8_ = uVar3;
    Point3fi::operator+=(&local_88,(Vector3<float> *)local_38);
    auVar11 = ZEXT1664(local_48);
    if (tMax != (Float *)0x0) {
      *tMax = *tMax - (float)local_68._0_4_;
    }
  }
  auVar6._4_4_ = local_88.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar6._8_4_ = local_88.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar6._0_4_ = local_88.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar6._12_4_ =
       local_88.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  uVar4 = (r->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  auVar7 = vinsertps_avx(auVar6,ZEXT416((uint)local_88.super_Point3<pbrt::Interval<float>_>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                              high),0x10);
  FVar2 = r->time;
  auVar16._0_4_ =
       local_88.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar7._0_4_;
  auVar16._4_4_ =
       local_88.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar7._4_4_;
  auVar16._8_4_ = auVar7._8_4_ + 0.0;
  auVar16._12_4_ = auVar7._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  auVar7 = vmulps_avx512vl(auVar16,auVar5);
  uVar3 = vmovlps_avx(auVar7);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z =
       (local_88.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       local_88.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  uVar3 = vmovlps_avx(local_58);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = auVar11._0_4_;
  __return_storage_ptr__->time = FVar2;
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar4;
  return __return_storage_ptr__;
}

Assistant:

inline Ray Transform::operator()(const Ray &r, Float *tMax) const {
    Vector3f oError;
    Point3fi o = (*this)(Point3fi(r.o));
    Vector3f d = (*this)(r.d);
    // Offset ray origin to edge of error bounds and compute _tMax_
    if (Float lengthSquared = LengthSquared(d); lengthSquared > 0) {
        Float dt = Dot(Abs(d), oError) / lengthSquared;
        o += d * dt;
        if (tMax)
            *tMax -= dt;
    }

    return Ray(Point3f(o), d, r.time, r.medium);
}